

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test>
::CreateTest(TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test>
             *this)

{
  Test *this_00;
  TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test>
  *this_local;
  
  this_00 = (Test *)operator_new(0x88);
  google::protobuf::compiler::anon_unknown_0::CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test::
  CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test
            ((CodeGeneratorTest_GetResolvedSourceFeaturesRoot_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }